

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O0

void __thiscall
Assimp::X3DImporter::XML_ReadNode_GetAttrVal_AsListVec2f
          (X3DImporter *this,int pAttrIdx,
          list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *pValue)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  pointer pFVar4;
  undefined4 extraout_var;
  reference pfVar5;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_98;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_90;
  aiVector2t<float> local_88;
  aiVector2D tvec;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_78;
  iterator it;
  string local_68;
  undefined1 local_38 [8];
  vector<float,_std::allocator<float>_> tlist;
  list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *pValue_local;
  int pAttrIdx_local;
  X3DImporter *this_local;
  
  tlist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)pValue;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_38);
  XML_ReadNode_GetAttrVal_AsArrF(this,pAttrIdx,(vector<float,_std::allocator<float>_> *)local_38);
  sVar3 = std::vector<float,_std::allocator<float>_>::size
                    ((vector<float,_std::allocator<float>_> *)local_38);
  if ((sVar3 & 1) != 0) {
    pFVar4 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    iVar2 = (*(pFVar4->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                      (pFVar4,(ulong)(uint)pAttrIdx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_68,(char *)CONCAT44(extraout_var,iVar2),
               (allocator *)((long)&it._M_current + 7));
    Throw_ConvertFail_Str2ArrF(this,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_current + 7));
  }
  local_78._M_current =
       (float *)std::vector<float,_std::allocator<float>_>::begin
                          ((vector<float,_std::allocator<float>_> *)local_38);
  while( true ) {
    tvec = (aiVector2D)
           std::vector<float,_std::allocator<float>_>::end
                     ((vector<float,_std::allocator<float>_> *)local_38);
    bVar1 = __gnu_cxx::operator!=
                      (&local_78,
                       (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *)
                       &tvec);
    if (!bVar1) break;
    aiVector2t<float>::aiVector2t(&local_88);
    local_90 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
               operator++(&local_78,0);
    pfVar5 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
             operator*(&local_90);
    local_88.x = *pfVar5;
    local_98 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
               operator++(&local_78,0);
    pfVar5 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
             operator*(&local_98);
    local_88.y = *pfVar5;
    std::__cxx11::list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::push_back
              ((list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)
               tlist.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,&local_88);
  }
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_38);
  return;
}

Assistant:

void X3DImporter::XML_ReadNode_GetAttrVal_AsListVec2f(const int pAttrIdx, std::list<aiVector2D>& pValue)
{
    std::vector<float> tlist;

	XML_ReadNode_GetAttrVal_AsArrF(pAttrIdx, tlist);// read as list
    if ( tlist.size() % 2 )
    {
        Throw_ConvertFail_Str2ArrF( mReader->getAttributeValue( pAttrIdx ) );
    }

	// copy data to array
	for(std::vector<float>::iterator it = tlist.begin(); it != tlist.end();)
	{
		aiVector2D tvec;

		tvec.x = *it++;
		tvec.y = *it++;
		pValue.push_back(tvec);
	}
}